

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ushort uVar1;
  SrcList *pSVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  Bitmask BVar7;
  long lVar8;
  Bitmask BVar9;
  
  BVar9 = 0;
  for (; pS != (Select *)0x0; pS = pS->pPrior) {
    pSVar2 = pS->pSrc;
    BVar3 = exprListTableUsage(pMaskSet,pS->pEList);
    BVar4 = exprListTableUsage(pMaskSet,pS->pGroupBy);
    BVar5 = exprListTableUsage(pMaskSet,pS->pOrderBy);
    BVar6 = exprTableUsage(pMaskSet,pS->pWhere);
    BVar7 = exprTableUsage(pMaskSet,pS->pHaving);
    BVar9 = BVar7 | BVar9 | BVar6 | BVar5 | BVar4 | BVar3;
    if (pSVar2 != (SrcList *)0x0) {
      uVar1 = pSVar2->nSrc;
      if ((short)uVar1 < 1) {
        uVar1 = 0;
      }
      for (lVar8 = 0; (ulong)uVar1 * 0x68 - lVar8 != 0; lVar8 = lVar8 + 0x68) {
        BVar3 = exprSelectTableUsage(pMaskSet,*(Select **)((long)&pSVar2->a[0].pSelect + lVar8));
        BVar4 = exprTableUsage(pMaskSet,*(Expr **)((long)&pSVar2->a[0].pOn + lVar8));
        BVar9 = BVar9 | BVar4 | BVar3;
      }
    }
  }
  return BVar9;
}

Assistant:

static Bitmask exprSelectTableUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= exprListTableUsage(pMaskSet, pS->pEList);
    mask |= exprListTableUsage(pMaskSet, pS->pGroupBy);
    mask |= exprListTableUsage(pMaskSet, pS->pOrderBy);
    mask |= exprTableUsage(pMaskSet, pS->pWhere);
    mask |= exprTableUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectTableUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= exprTableUsage(pMaskSet, pSrc->a[i].pOn);
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}